

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_test.cc
# Opt level: O2

void __thiscall
phmap::priv::anon_unknown_0::Btree_ConstIteratorAccessors_Test::~Btree_ConstIteratorAccessors_Test
          (Btree_ConstIteratorAccessors_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Btree, ConstIteratorAccessors) {
        phmap::btree_set<int> set;
        for (int i = 0; i < 100; ++i) {
            set.insert(i);
        }

        auto it = set.cbegin();
        auto r_it = set.crbegin();
        for (int i = 0; i < 100; ++i, ++it, ++r_it) {
            ASSERT_EQ(*it, i);
            ASSERT_EQ(*r_it, 99 - i);
        }
        EXPECT_EQ(it, set.cend());
        EXPECT_EQ(r_it, set.crend());
    }